

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

bool P_Move(AActor *actor)

{
  DVector3 *pDVar1;
  byte *pbVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  sector_t *sec;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double x;
  double y;
  bool bVar11;
  int iVar12;
  AActor *this;
  ASectorAction *pAVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  line_t *plVar27;
  double dVar28;
  double friction;
  TAngle<double> local_178;
  undefined8 uStack_170;
  spechit_t spec;
  double local_138;
  undefined1 local_108 [24];
  double dStack_f0;
  TVector2<double> local_e8;
  undefined1 local_d8 [16];
  FCheckPosition tm;
  
  dVar28 = actor->Speed;
  friction = 0.90625;
  uVar5 = (actor->flags2).Value;
  bVar15 = 1;
  if ((uVar5 & 8) != 0) goto LAB_003fbbff;
  if ((actor->movedir == 8) ||
     ((((((actor->flags).Value & 0x200) == 0 && (((actor->flags6).Value & 0x400) == 0)) &&
       ((uVar5 >> 0xb & 1) == 0)) &&
      (dVar26 = (actor->__Pos).Z, actor->floorz <= dVar26 && dVar26 != actor->floorz)))) {
    bVar15 = 0;
    goto LAB_003fbbff;
  }
  if (7 < actor->movedir) {
    I_Error("Weird actor->movedir!");
  }
  this = GC::ReadBarrier<AActor>((AActor **)&actor->target);
  iVar12 = 0;
  if (((this != (AActor *)0x0) && (iVar12 = 0, ((actor->flags6).Value & 0x800) != 0)) &&
     (bVar11 = AActor::IsFriend(this,actor), !bVar11)) {
    iVar12 = 0;
    dVar26 = AActor::Distance2D(actor,this,false);
    if (dVar26 < 144.0) {
      iVar12 = FRandom::operator()(&pr_dropoff);
      iVar12 = (uint)(iVar12 < 0xeb) * 2;
    }
  }
  if ((compatflags.Value._3_1_ & 1) == 0) {
    local_138 = 0.03125;
  }
  else {
    local_138 = P_GetMoveFactor(actor,&friction);
    if (friction < 0.90625) {
      dVar28 = dVar28 * ((0.03125 - local_138) * -0.5 + 0.03125) * 32.0;
      if ((dVar28 == 0.0) && (!NAN(dVar28))) {
        dVar28 = actor->Speed;
      }
    }
  }
  plVar27 = (line_t *)(xspeed[actor->movedir] * dVar28);
  dVar28 = yspeed[actor->movedir] * dVar28;
  dVar26 = actor->radius + -1.0;
  iVar14 = 1;
  iVar17 = 1;
  if (0.0 < dVar26) {
    dVar10 = ABS(dVar28);
    if (dVar10 < ABS((double)plVar27)) {
      dVar10 = ABS((double)plVar27);
    }
    if (dVar26 < dVar10) {
      iVar17 = (int)(dVar10 / dVar26) + 1;
    }
  }
  pDVar1 = &actor->__Pos;
  x = pDVar1->X;
  y = (actor->__Pos).Y;
  local_108._0_8_ = pDVar1->X;
  local_108._8_8_ = pDVar1->Y;
  FCheckPosition::FCheckPosition(&tm,false);
  tm.FromPMove = true;
  dVar26 = (actor->Angles).Yaw.Degrees;
  dVar10 = 1.0 / (double)iVar17;
  iVar16 = 0;
  if (0 < iVar17) {
    iVar16 = iVar17;
  }
  auVar8._8_4_ = SUB84(dVar10,0);
  auVar8._0_8_ = dVar10;
  auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
  local_178.Degrees = (double)plVar27;
  uStack_170 = dVar28;
  for (; iVar14 - iVar16 != 1; iVar14 = iVar14 + 1) {
    dVar9 = (double)iVar14;
    local_d8._8_4_ = SUB84(dVar9,0);
    local_d8._0_8_ = dVar9;
    local_d8._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dStack_f0 = auVar8._8_8_;
    dVar7 = uStack_170 * dVar9 * dStack_f0 + (double)local_108._8_8_;
    spec.Oldrefpos.X._0_4_ = SUB84(dVar7,0);
    spec.line = (line_t *)(local_178.Degrees * dVar9 * dVar10 + (double)local_108._0_8_);
    spec.Oldrefpos.X._4_4_ = (int)((ulong)dVar7 >> 0x20);
    bVar11 = P_TryMove(actor,(DVector2 *)&spec,iVar12,(secplane_t *)0x0,&tm,false);
    if (!bVar11) break;
    if (1 < iVar17) {
      uVar3 = (actor->__Pos).X;
      uVar4 = (actor->__Pos).Y;
      uVar18 = (undefined4)uVar3;
      uVar19 = (undefined4)((ulong)uVar3 >> 0x20);
      uVar20 = (undefined4)uVar4;
      uVar21 = (undefined4)((ulong)uVar4 >> 0x20);
      if (((double)uVar3 == (double)spec.line) && (!NAN((double)uVar3) && !NAN((double)spec.line)))
      {
        if (((double)uVar4 == spec.Oldrefpos.X) && (!NAN((double)uVar4) && !NAN(spec.Oldrefpos.X)))
        goto LAB_003fb8f5;
      }
      dVar7 = (double)SUB84(((actor->Angles).Yaw.Degrees - dVar26) * 11930464.711111112 +
                            6755399441055744.0,0) * 8.381903171539307e-08;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        TVector2<double>::Rotated<double>(&local_e8,&local_178);
        local_178.Degrees = local_e8.X;
        uStack_170 = local_e8.Y;
        dVar26 = (actor->Angles).Yaw.Degrees;
        uVar18 = *(undefined4 *)&(actor->__Pos).X;
        uVar19 = *(undefined4 *)((long)&(actor->__Pos).X + 4);
        uVar20 = *(undefined4 *)&(actor->__Pos).Y;
        uVar21 = *(undefined4 *)((long)&(actor->__Pos).Y + 4);
        uVar22 = local_e8.X._0_4_;
        uVar23 = local_e8.X._4_4_;
        uVar24 = local_e8.Y._0_4_;
        uVar25 = local_e8.Y._4_4_;
      }
      else {
        uVar22 = local_178.Degrees._0_4_;
        uVar23 = local_178.Degrees._4_4_;
        uVar24 = (undefined4)uStack_170;
        uVar25 = uStack_170._4_4_;
      }
      dVar7 = (double)CONCAT44(uVar21,uVar20) -
              (double)CONCAT44(uVar25,uVar24) * (double)local_d8._8_8_ * dStack_f0;
      local_108._8_4_ = SUB84(dVar7,0);
      local_108._0_8_ =
           (double)CONCAT44(uVar19,uVar18) -
           (double)CONCAT44(uVar23,uVar22) * (double)local_d8._0_8_ * dVar10;
      local_108._12_4_ = (int)((ulong)dVar7 >> 0x20);
    }
LAB_003fb8f5:
  }
  if (nomonsterinterpolation.Value == true) {
    AActor::ClearInterpolation(actor);
  }
  if ((iVar17 < iVar14) && (0.90625 < friction)) {
    AActor::SetOrigin(actor,x,y,(actor->__Pos).Z,false);
    dVar26 = (actor->Vel).X + local_138 * 8.0 * (double)plVar27;
    dVar28 = (actor->Vel).Y + local_138 * 8.0 * dVar28;
    auVar6._8_4_ = SUB84(dVar28,0);
    auVar6._0_8_ = dVar26;
    auVar6._12_4_ = (int)((ulong)dVar28 >> 0x20);
    (actor->Vel).X = dVar26;
    (actor->Vel).Y = (double)auVar6._8_8_;
  }
  if (iVar17 < iVar14) {
    if ((((actor->flags).Value & 0x200) == 0) && (((actor->flags6).Value & 0x400) == 0)) {
      dVar28 = (actor->__Pos).Z;
      dVar26 = actor->floorz;
      if ((dVar26 < dVar28) &&
         ((((actor->flags2).Value & 0x800) == 0 && (dVar28 <= actor->MaxStepHeight + dVar26)))) {
        (actor->__Pos).Z = dVar26;
        bVar11 = P_TestMobjZ(actor,true,(AActor **)0x0);
        if (bVar11) {
          pAVar13 = GC::ReadBarrier<ASectorAction>
                              ((ASectorAction **)&actor->floorsector->SecActTarget);
          if (pAVar13 != (ASectorAction *)0x0) {
            dVar28 = actor->floorz;
            sec = actor->floorsector;
            AActor::PosRelative((DVector3 *)&spec,actor,sec);
            local_e8.X = (double)spec.line;
            local_e8.Y = spec.Oldrefpos.X;
            dVar26 = secplane_t::ZatPoint(&sec->floorplane,&local_e8);
            if ((dVar28 == dVar26) && (!NAN(dVar28) && !NAN(dVar26))) {
              pAVar13 = GC::ReadBarrier<ASectorAction>
                                  ((ASectorAction **)&actor->floorsector->SecActTarget);
              ASectorAction::TriggerAction(pAVar13,actor,4);
            }
          }
          P_CheckFor3DFloorHit(actor,(actor->__Pos).Z);
        }
        else {
          (actor->__Pos).Z = dVar28;
        }
      }
    }
    pbVar2 = (byte *)((long)&(actor->flags).Value + 2);
    *pbVar2 = *pbVar2 & 0xdf;
LAB_003fbbef:
    bVar15 = 1;
  }
  else {
    if (((((actor->flags6).Value & 0x400) != 0) || (((actor->flags).Value & 0x4000) != 0)) &&
       (tm.floatok == true)) {
      dVar28 = (actor->__Pos).Z;
      (actor->__Pos).Z =
           (double)(~-(ulong)(dVar28 < tm.floorz) & (ulong)-actor->FloatSpeed |
                   (ulong)actor->FloatSpeed & -(ulong)(dVar28 < tm.floorz)) + dVar28;
      bVar11 = P_TestMobjZ(actor,true,(AActor **)0x0);
      if (bVar11) {
        pbVar2 = (byte *)((long)&(actor->flags).Value + 2);
        *pbVar2 = *pbVar2 | 0x20;
        goto LAB_003fbbef;
      }
      (actor->__Pos).Z = dVar28;
    }
    if (spechit.Count != 0) {
      actor->movedir = '\b';
      if (((actor->flags6).Value & 0x10000) == 0) {
        bVar15 = 0;
LAB_003fbb48:
        bVar11 = TArray<spechit_t,_spechit_t>::Pop(&spechit,&spec);
        if (bVar11) {
          if (((actor->flags4).Value & 0x200) == 0) goto LAB_003fbb79;
          bVar11 = P_ActivateLine((line_t_conflict *)spec.line,actor,0,2,(DVector3 *)0x0);
          if (!bVar11) goto LAB_003fbb79;
          goto LAB_003fbb9a;
        }
        if (bVar15 != 0) {
          iVar12 = FRandom::operator()(&pr_opendoor);
          bVar15 = bVar15 ^ 0xca < iVar12;
          goto LAB_003fbbf2;
        }
      }
      else {
        TArray<spechit_t,_spechit_t>::Clear(&spechit);
      }
    }
    bVar15 = 0;
  }
LAB_003fbbf2:
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::~TMap(&tm.LastRipped);
LAB_003fbbff:
  return (bool)(bVar15 & 1);
LAB_003fbb79:
  if (((actor->flags2).Value & 0x400000) != 0) {
    bVar11 = P_ActivateLine((line_t_conflict *)spec.line,actor,0,0x10,(DVector3 *)0x0);
    if (bVar11) {
LAB_003fbb9a:
      bVar15 = bVar15 | (spec.line != actor->BlockingLine) + 1U;
    }
  }
  goto LAB_003fbb48;
}

Assistant:

bool P_Move (AActor *actor)
{

	double tryx, tryy, deltax, deltay, origx, origy;
	bool try_ok;
	double speed = actor->Speed;
	double movefactor = ORIG_FRICTION_FACTOR;
	double friction = ORIG_FRICTION;
	int dropoff = 0;

	if (actor->flags2 & MF2_BLASTED)
	{
		return true;
	}

	if (actor->movedir == DI_NODIR)
	{
		return false;
	}

	// [RH] Walking actors that are not on the ground cannot walk. We don't
	// want to yank them to the ground here as Doom did, since that makes
	// it difficult to thrust them vertically in a reasonable manner.
	// [GZ] Let jumping actors jump.
	if (!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
		&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		return false;
	}

	if ((unsigned)actor->movedir >= 8)
		I_Error ("Weird actor->movedir!");

	// killough 10/98: allow dogs to drop off of taller ledges sometimes.
	// dropoff==1 means always allow it, dropoff==2 means only up to 128 high,
	// and only if the target is immediately on the other side of the line.
	AActor *target = actor->target;

	if ((actor->flags6 & MF6_JUMPDOWN) && target &&
			!(target->IsFriend(actor)) &&
			actor->Distance2D(target) < 144 &&
			pr_dropoff() < 235)
	{
		dropoff = 2;
	}

	// [RH] I'm not so sure this is such a good idea
	// [GZ] That's why it's compat-optioned.
	if (compatflags & COMPATF_MBFMONSTERMOVE)
	{
		// killough 10/98: make monsters get affected by ice and sludge too:
		movefactor = P_GetMoveFactor (actor, &friction);

		if (friction < ORIG_FRICTION)
		{ // sludge
			speed = speed * ((ORIG_FRICTION_FACTOR - (ORIG_FRICTION_FACTOR-movefactor)/2)) / ORIG_FRICTION_FACTOR;
			if (speed == 0)
			{ // always give the monster a little bit of speed
				speed = actor->Speed;
			}
		}
	}

	tryx = (origx = actor->X()) + (deltax = (speed * xspeed[actor->movedir]));
	tryy = (origy = actor->Y()) + (deltay = (speed * yspeed[actor->movedir]));

	// Like P_XYMovement this should do multiple moves if the step size is too large

	double maxmove = actor->radius - 1;
	int steps = 1;

	if (maxmove > 0)
	{ 
		const double xspeed = fabs (deltax);
		const double yspeed = fabs (deltay);

		if (xspeed > yspeed)
		{
			if (xspeed > maxmove)
			{
				steps = 1 + int(xspeed / maxmove);
			}
		}
		else
		{
			if (yspeed > maxmove)
			{
				steps = 1 + int(yspeed / maxmove);
			}
		}
	}
	FCheckPosition tm;

	tm.FromPMove = true;

	DVector2 start = { origx, origy };
	DVector2 move = { deltax, deltay };
	DAngle oldangle = actor->Angles.Yaw;

	try_ok = true;
	for (int i = 1; i <= steps; i++)
	{
		DVector2 ptry = start + move * i / steps;
		// killough 3/15/98: don't jump over dropoffs:
		try_ok = P_TryMove(actor, ptry, dropoff, NULL, tm);
		if (!try_ok) break;

		// Handle portal transitions just like P_XYMovement.
		if (steps > 1 && actor->Pos().XY() != ptry)
		{
			DAngle anglediff = deltaangle(oldangle, actor->Angles.Yaw);

			if (anglediff != 0)
			{
				move = move.Rotated(anglediff);
				oldangle = actor->Angles.Yaw;
			}
			start = actor->Pos() - move * i / steps;
		}
	}

	// [GrafZahl] Interpolating monster movement as it is done here just looks bad
	// so make it switchable
	if (nomonsterinterpolation)
	{
		actor->ClearInterpolation();
	}

	if (try_ok && friction > ORIG_FRICTION)
	{
		actor->SetOrigin(origx, origy, actor->Z(), false);
		movefactor *= 1.f / ORIG_FRICTION_FACTOR / 4;
		actor->Vel.X += deltax * movefactor;
		actor->Vel.Y += deltay * movefactor;
	}

	// [RH] If a walking monster is no longer on the floor, move it down
	// to the floor if it is within MaxStepHeight, presuming that it is
	// actually walking down a step.
	if (try_ok &&
		!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
			&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		if (actor->Z() <= actor->floorz + actor->MaxStepHeight)
		{
			double savedz = actor->Z();
			actor->SetZ(actor->floorz);
			// Make sure that there isn't some other actor between us and
			// the floor we could get stuck in. The old code did not do this.
			if (!P_TestMobjZ(actor))
			{
				actor->SetZ(savedz);
			}
			else
			{ // The monster just hit the floor, so trigger any actions.
				if (actor->floorsector->SecActTarget != NULL &&
					actor->floorz == actor->floorsector->floorplane.ZatPoint(actor->PosRelative(actor->floorsector)))
				{
					actor->floorsector->SecActTarget->TriggerAction(actor, SECSPAC_HitFloor);
				}
				P_CheckFor3DFloorHit(actor, actor->Z());
			}
		}
	}

	if (!try_ok)
	{
		if (((actor->flags6 & MF6_CANJUMP)||(actor->flags & MF_FLOAT)) && tm.floatok)
		{ // must adjust height
			double savedz = actor->Z();

			if (actor->Z() < tm.floorz)
				actor->AddZ(actor->FloatSpeed);
			else
				actor->AddZ(-actor->FloatSpeed);


			// [RH] Check to make sure there's nothing in the way of the float
			if (P_TestMobjZ (actor))
			{
				actor->flags |= MF_INFLOAT;
				return true;
			}
			actor->SetZ(savedz);
		}

		if (!spechit.Size ())
		{
			return false;
		}

		// open any specials
		actor->movedir = DI_NODIR;

		// if the special is not a door that can be opened, return false
		//
		// killough 8/9/98: this is what caused monsters to get stuck in
		// doortracks, because it thought that the monster freed itself
		// by opening a door, even if it was moving towards the doortrack,
		// and not the door itself.
		//
		// killough 9/9/98: If a line blocking the monster is activated,
		// return true 90% of the time. If a line blocking the monster is
		// not activated, but some other line is, return false 90% of the
		// time. A bit of randomness is needed to ensure it's free from
		// lockups, but for most cases, it returns the correct result.
		//
		// Do NOT simply return false 1/4th of the time (causes monsters to
		// back out when they shouldn't, and creates secondary stickiness).

		spechit_t spec;
		int good = 0;
		
		if (!(actor->flags6 & MF6_NOTRIGGER))
		{
			while (spechit.Pop (spec))
			{
				// [RH] let monsters push lines, as well as use them
				if (((actor->flags4 & MF4_CANUSEWALLS) && P_ActivateLine (spec.line, actor, 0, SPAC_Use)) ||
					((actor->flags2 & MF2_PUSHWALL) && P_ActivateLine (spec.line, actor, 0, SPAC_Push)))
				{
					good |= spec.line == actor->BlockingLine ? 1 : 2;
				}
			}
		}
		else spechit.Clear();
		return good && ((pr_opendoor() >= 203) ^ (good & 1));
	}
	else
	{
		actor->flags &= ~MF_INFLOAT;
	}
	return true; 
}